

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O2

void __thiscall hdc::Def::~Def(Def *this)

{
  pointer ppPVar1;
  Parameter *this_00;
  pointer ppLVar2;
  Variable *this_01;
  SymbolTable *this_02;
  int i;
  ulong uVar3;
  int i_1;
  
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR_accept_0019aed8;
  for (uVar3 = 0;
      ppPVar1 = (this->parameters).
                super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->parameters).
                            super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
      uVar3 = uVar3 + 1) {
    this_00 = ppPVar1[uVar3];
    if (this_00 != (Parameter *)0x0) {
      Parameter::~Parameter(this_00);
    }
    operator_delete(this_00);
  }
  uVar3 = 0;
  while( true ) {
    ppLVar2 = (this->localVariables).
              super__Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->localVariables).
                      super__Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3) <= uVar3)
    break;
    this_01 = &ppLVar2[uVar3]->super_Variable;
    if (this_01 != (Variable *)0x0) {
      Variable::~Variable(this_01);
    }
    operator_delete(this_01);
    uVar3 = uVar3 + 1;
  }
  if (this->return_type != (Type *)0x0) {
    (*(this->return_type->super_ASTNode)._vptr_ASTNode[2])();
  }
  if (this->statements != (CompoundStatement *)0x0) {
    (*(this->statements->super_Statement).super_ASTNode._vptr_ASTNode[2])();
  }
  this_02 = this->symbolTable;
  if (this_02 != (SymbolTable *)0x0) {
    SymbolTable::~SymbolTable(this_02);
  }
  operator_delete(this_02);
  std::_Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>::~_Vector_base
            (&(this->localVariables).
              super__Vector_base<hdc::LocalVariable_*,_std::allocator<hdc::LocalVariable_*>_>);
  std::_Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>::~_Vector_base
            (&(this->parameters).
              super__Vector_base<hdc::Parameter_*,_std::allocator<hdc::Parameter_*>_>);
  std::__cxx11::string::~string((string *)&(this->name).lexem);
  return;
}

Assistant:

Def::~Def() {
    for (int i = 0; i < parameters.size(); ++i) {
        delete parameters[i];
    }

    for (int i = 0; i < localVariables.size(); ++i) {
        delete localVariables[i];
    }

    delete return_type;
    delete statements;
    delete symbolTable;
}